

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Responses.cpp
# Opt level: O3

int Response::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                    timeval *__timeout)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  undefined4 in_register_0000003c;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  *this;
  json_value local_60;
  undefined1 local_58 [8];
  json_value local_50;
  string local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  
  this = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          *)CONCAT44(in_register_0000003c,__nfds);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"select","");
  Response((Response *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_58[0] = null;
  local_50.object = (object_t *)0x0;
  nlohmann::detail::
  to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[4],_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_58,(char (*) [4])"raw");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>(this,"result");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar3,"mode");
  vVar1 = pvVar3->m_type;
  pvVar3->m_type = local_58[0];
  jVar2 = pvVar3->m_value;
  (pvVar3->m_value).object = (object_t *)local_50;
  local_58[0] = vVar1;
  local_50 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_58 + 8),vVar1);
  local_60.object = (object_t *)0x0;
  local_48._M_dataplus._M_p = (pointer)__readfds->fds_bits[0];
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__readfds->fds_bits[1];
  local_60.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                 ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_48,&local_28);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>(this,"result");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar3,"files");
  vVar1 = pvVar3->m_type;
  pvVar3->m_type = array;
  jVar2 = pvVar3->m_value;
  (pvVar3->m_value).object = (object_t *)local_60;
  local_60 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_60.boolean,vVar1);
  write_counters((Response *)this,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QueryCounter,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QueryCounter>_>_>
                  *)__writefds);
  return __nfds;
}

Assistant:

Response Response::select(
    const std::vector<std::string> &files,
    const std::unordered_map<std::string, QueryCounter> &counters) {
    Response r("select");
    r.content["result"]["mode"] = "raw";
    r.content["result"]["files"] = files;

    r.write_counters(counters);

    return r;
}